

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O2

void __thiscall embree::XMLWriter::store(XMLWriter *this,char *name,AffineSpace3fa *space)

{
  undefined1 *puVar1;
  ostream *poVar2;
  
  tab(this);
  puVar1 = &this->field_0x10;
  poVar2 = std::operator<<((ostream *)puVar1,"<");
  poVar2 = std::operator<<(poVar2,name);
  poVar2 = std::operator<<(poVar2,">");
  std::endl<char,std::char_traits<char>>(poVar2);
  tab(this);
  poVar2 = std::operator<<((ostream *)puVar1,"  ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(space->l).vx.field_0.m128[0]);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(space->l).vy.field_0.m128[0]);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(space->l).vz.field_0.m128[0]);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(space->p).field_0.m128[0]);
  std::endl<char,std::char_traits<char>>(poVar2);
  tab(this);
  poVar2 = std::operator<<((ostream *)puVar1,"  ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(space->l).vx.field_0.m128[1]);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(space->l).vy.field_0.m128[1]);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(space->l).vz.field_0.m128[1]);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(space->p).field_0.m128[1]);
  std::endl<char,std::char_traits<char>>(poVar2);
  tab(this);
  poVar2 = std::operator<<((ostream *)puVar1,"  ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(space->l).vx.field_0.m128[2]);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(space->l).vy.field_0.m128[2]);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(space->l).vz.field_0.m128[2]);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(space->p).field_0.m128[2]);
  std::endl<char,std::char_traits<char>>(poVar2);
  tab(this);
  poVar2 = std::operator<<((ostream *)puVar1,"</");
  poVar2 = std::operator<<(poVar2,name);
  poVar2 = std::operator<<(poVar2,">");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void XMLWriter::store(const char* name, const AffineSpace3fa& space)
  {
    tab(); xml << "<" << name << ">" << std::endl;
    tab(); xml << "  " << space.l.vx.x << " " << space.l.vy.x << " " << space.l.vz.x << " " << space.p.x << std::endl;
    tab(); xml << "  " << space.l.vx.y << " " << space.l.vy.y << " " << space.l.vz.y << " " << space.p.y << std::endl;
    tab(); xml << "  " << space.l.vx.z << " " << space.l.vy.z << " " << space.l.vz.z << " " << space.p.z << std::endl;
    tab(); xml << "</" << name << ">" << std::endl;
  }